

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_core.c
# Opt level: O1

int WebRtcVad_CalcVad32khz(VadInstT *inst,int16_t *speech_frame,size_t frame_length)

{
  int iVar1;
  int16_t speechNB [240];
  int16_t speechWB [480];
  int16_t aiStack_5c8 [240];
  int16_t local_3e8 [480];
  
  WebRtcVad_Downsampling(speech_frame,local_3e8,inst->downsampling_filter_states + 2,frame_length);
  WebRtcVad_Downsampling(local_3e8,aiStack_5c8,inst->downsampling_filter_states,frame_length >> 1);
  iVar1 = WebRtcVad_CalcVad8khz(inst,aiStack_5c8,frame_length >> 2);
  return iVar1;
}

Assistant:

int WebRtcVad_CalcVad32khz(VadInstT* inst, const int16_t* speech_frame,
                           size_t frame_length)
{
    size_t len;
    int vad;
    int16_t speechWB[480]; // Downsampled speech frame: 960 samples (30ms in SWB)
    int16_t speechNB[240]; // Downsampled speech frame: 480 samples (30ms in WB)


    // Downsample signal 32->16->8 before doing VAD
    WebRtcVad_Downsampling(speech_frame, speechWB, &(inst->downsampling_filter_states[2]),
                           frame_length);
    len = frame_length / 2;

    WebRtcVad_Downsampling(speechWB, speechNB, inst->downsampling_filter_states, len);
    len /= 2;

    // Do VAD on an 8 kHz signal
    vad = WebRtcVad_CalcVad8khz(inst, speechNB, len);

    return vad;
}